

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg2.hpp
# Opt level: O1

void __thiscall trng::mrg2::jump2(mrg2 *this,uint s)

{
  long lVar1;
  long lVar2;
  int32_t *piVar3;
  undefined8 *puVar4;
  long lVar5;
  long lVar6;
  int k;
  long lVar7;
  uint uVar8;
  bool bVar9;
  result_type d [2];
  result_type c [4];
  status_type local_58;
  undefined8 local_50;
  int32_t local_48 [2];
  int32_t local_40 [2];
  undefined8 local_38;
  int32_t aiStack_30 [2];
  
  local_38._0_4_ = 0;
  local_38._4_4_ = 0;
  aiStack_30[0] = 0;
  aiStack_30[1] = 0;
  local_48 = (int32_t  [2])*(undefined8 *)(this->P).a;
  local_40[0] = 1;
  local_40[1] = 0;
  if (s != 0) {
    uVar8 = 0;
    do {
      int_math::matrix_mult<2>
                ((int32_t (*) [4])local_48,(int32_t (*) [4])local_48,(int32_t (*) [4])&local_38,
                 0x7fffffff);
      if (s <= uVar8 + 1) break;
      int_math::matrix_mult<2>
                ((int32_t (*) [4])&local_38,(int32_t (*) [4])&local_38,(int32_t (*) [4])local_48,
                 0x7fffffff);
      uVar8 = uVar8 + 2;
    } while (uVar8 < s);
  }
  local_50 = *(undefined8 *)(this->S).r;
  if ((s & 1) == 0) {
    piVar3 = local_48;
    lVar5 = 0;
    do {
      lVar7 = 0;
      lVar6 = 0;
      do {
        lVar2 = ((long)*(int *)((long)&local_50 + lVar7 * 4) * (long)piVar3[lVar7]) % 0x7fffffff;
        lVar1 = lVar2 + lVar6;
        lVar6 = lVar6 + -0x7fffffff + lVar2;
        if (lVar1 < 0x7fffffff) {
          lVar6 = lVar1;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 == 1);
      local_58.r[lVar5] = (int)lVar6;
      piVar3 = piVar3 + 2;
      bVar9 = lVar5 == 0;
      lVar5 = lVar5 + 1;
    } while (bVar9);
  }
  else {
    puVar4 = &local_38;
    lVar5 = 0;
    do {
      lVar7 = 0;
      lVar6 = 0;
      do {
        lVar2 = ((long)*(int *)((long)&local_50 + lVar7 * 4) *
                (long)*(int *)((long)puVar4 + lVar7 * 4)) % 0x7fffffff;
        lVar1 = lVar2 + lVar6;
        lVar6 = lVar6 + -0x7fffffff + lVar2;
        if (lVar1 < 0x7fffffff) {
          lVar6 = lVar1;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 == 1);
      local_58.r[lVar5] = (int)lVar6;
      puVar4 = puVar4 + 1;
      bVar9 = lVar5 == 0;
      lVar5 = lVar5 + 1;
    } while (bVar9);
  }
  *&(this->S).r = local_58.r;
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void mrg2::jump2(unsigned int s) {
    result_type b[4], c[4]{};
    b[0] = P.a[0];
    b[1] = P.a[1];
    b[2] = 1;
    b[3] = 0;
    for (unsigned int i{0}; i < s; ++i) {
      int_math::matrix_mult<2>(b, b, c, modulus);
      ++i;
      if (not(i < s))
        break;
      int_math::matrix_mult<2>(c, c, b, modulus);
    }
    const result_type r[2]{S.r[0], S.r[1]};
    result_type d[2];
    if ((s & 1u) == 0)
      int_math::matrix_vec_mult<2>(b, r, d, modulus);
    else
      int_math::matrix_vec_mult<2>(c, r, d, modulus);
    S.r[0] = d[0];
    S.r[1] = d[1];
  }